

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O2

char * archive_read_disk_entry_setup_path(archive_read_disk *a,archive_entry *entry,int *fd)

{
  int iVar1;
  mode_t mVar2;
  char *pcVar3;
  tree *ptVar4;
  
  pcVar3 = archive_entry_sourcepath(entry);
  if (((pcVar3 == (char *)0x0) ||
      ((a->tree != (tree *)0x0 && (iVar1 = (*a->tree_enter_working_dir)(a->tree), iVar1 != 0)))) &&
     (pcVar3 = archive_entry_pathname(entry), pcVar3 == (char *)0x0)) {
    archive_set_error(&a->archive,-1,"Couldn\'t determine path");
    return (char *)0x0;
  }
  if (((fd != (int *)0x0) && (*fd < 0)) && (ptVar4 = a->tree, ptVar4 != (tree *)0x0)) {
    if (a->follow_symlinks == '\0') {
      mVar2 = archive_entry_filetype(entry);
      if (mVar2 == 0xa000) {
        return pcVar3;
      }
      ptVar4 = a->tree;
    }
    iVar1 = (*a->open_on_current_dir)(ptVar4,pcVar3,0x800);
    *fd = iVar1;
  }
  return pcVar3;
}

Assistant:

const char *
archive_read_disk_entry_setup_path(struct archive_read_disk *a,
    struct archive_entry *entry, int *fd)
{
	const char *path;

	path = archive_entry_sourcepath(entry);

	if (path == NULL || (a->tree != NULL &&
	    a->tree_enter_working_dir(a->tree) != 0))
		path = archive_entry_pathname(entry);
	if (path == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		   "Couldn't determine path");
	} else if (fd != NULL && *fd < 0 && a->tree != NULL &&
	    (a->follow_symlinks || archive_entry_filetype(entry) != AE_IFLNK)) {
		*fd = a->open_on_current_dir(a->tree, path,
		    O_RDONLY | O_NONBLOCK);
	}
	return (path);
}